

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::FunctionBody::GetBranchOffsetWithin
          (FunctionBody *this,uint start,uint end,StatementAdjustmentRecord *record)

{
  int iVar1;
  AuxStatementData *pAVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Type *other;
  int index;
  StatementAdjustmentRecord local_40;
  StatementAdjustmentRecord item;
  
  item.m_byteCodeOffset = start;
  item._4_4_ = end;
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f,"(start < end)","start < end");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pAVar2 = (this->m_sourceInfo).m_auxStatementData.ptr;
  uVar6 = 0;
  if ((pAVar2 != (AuxStatementData *)0x0) &&
     (uVar6 = 0,
     (pAVar2->m_statementAdjustmentRecords).ptr !=
     (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
      *)0x0)) {
    iVar1 = (((pAVar2->m_statementAdjustmentRecords).ptr)->
            super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
            ).count;
    bVar4 = 0 < iVar1;
    if (0 < iVar1) {
      index = 0;
      do {
        other = JsUtil::
                List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((((this->m_sourceInfo).m_auxStatementData.ptr)->m_statementAdjustmentRecords)
                       .ptr,index);
        StatementAdjustmentRecord::StatementAdjustmentRecord(&local_40,other);
        uVar5 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40);
        if ((item.m_byteCodeOffset < uVar5) &&
           (uVar5 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40),
           uVar5 < (uint)item._4_4_)) {
          record->m_adjustmentType = local_40.m_adjustmentType;
          record->m_byteCodeOffset = local_40.m_byteCodeOffset;
          break;
        }
        index = index + 1;
        bVar4 = index < iVar1;
      } while (index != iVar1);
    }
    uVar6 = (uint)bVar4;
  }
  return uVar6;
}

Assistant:

BOOL
    FunctionBody::GetBranchOffsetWithin(uint start, uint end, StatementAdjustmentRecord* record)
    {
        Assert(start < end);

        if (!this->GetStatementAdjustmentRecords())
        {
            // No Offset
            return FALSE;
        }

        int count = this->GetStatementAdjustmentRecords()->Count();
        for (int i = 0; i < count; i++)
        {
            StatementAdjustmentRecord item = this->GetStatementAdjustmentRecords()->Item(i);
            if (item.GetByteCodeOffset() > start && item.GetByteCodeOffset() < end)
            {
                *record = item;
                return TRUE;
            }
        }

        // No offset found in the range.
        return FALSE;
    }